

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O0

void __thiscall
LASwriteItemCompressed_RGBNIR14_v3::LASwriteItemCompressed_RGBNIR14_v3
          (LASwriteItemCompressed_RGBNIR14_v3 *this,ArithmeticEncoder *enc)

{
  uint local_1c;
  U32 c;
  ArithmeticEncoder *enc_local;
  LASwriteItemCompressed_RGBNIR14_v3 *this_local;
  
  LASwriteItemCompressed::LASwriteItemCompressed(&this->super_LASwriteItemCompressed);
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_001b0ee0;
  if (enc != (ArithmeticEncoder *)0x0) {
    this->enc = enc;
    this->outstream_RGB = (ByteStreamOutArray *)0x0;
    this->outstream_NIR = (ByteStreamOutArray *)0x0;
    this->enc_RGB = (ArithmeticEncoder *)0x0;
    this->enc_NIR = (ArithmeticEncoder *)0x0;
    this->num_bytes_RGB = 0;
    this->num_bytes_NIR = 0;
    this->changed_RGB = false;
    this->changed_NIR = false;
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      this->contexts[local_1c].m_rgb_bytes_used = (ArithmeticModel *)0x0;
    }
    this->current_context = 0;
    return;
  }
  __assert_fail("enc",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/laswriteitemcompressed_v3.cpp"
                ,0x57b,
                "LASwriteItemCompressed_RGBNIR14_v3::LASwriteItemCompressed_RGBNIR14_v3(ArithmeticEncoder *)"
               );
}

Assistant:

LASwriteItemCompressed_RGBNIR14_v3::LASwriteItemCompressed_RGBNIR14_v3(ArithmeticEncoder* enc)
{
  /* not used as a encoder. just gives access to outstream */

  assert(enc);
  this->enc = enc;

  /* zero outstreams and encoders */

  outstream_RGB = 0;
  outstream_NIR = 0;

  enc_RGB = 0;
  enc_NIR = 0;

  /* zero num_bytes and init booleans */

  num_bytes_RGB = 0;
  num_bytes_NIR = 0;

  changed_RGB = FALSE;
  changed_NIR = FALSE;

  /* mark the four scanner channel contexts as uninitialized */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].m_rgb_bytes_used = 0;
  }
  current_context = 0;
}